

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSharedLibrary.cpp
# Opt level: O0

void __thiscall MinVR::VRSharedLibrary::unload(VRSharedLibrary *this)

{
  long in_RDI;
  int result;
  char *error;
  int *in_stack_00000128;
  string *in_stack_00000130;
  string *in_stack_00000138;
  string *in_stack_00000140;
  char *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  allocator<char> local_f9;
  string local_f8 [8];
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [48];
  string local_78 [32];
  string local_58 [32];
  string local_38 [36];
  int local_14;
  char *local_10;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    local_10 = "";
    dlerror();
    local_14 = dlclose(*(undefined8 *)(in_RDI + 0x30));
    local_10 = (char *)dlerror();
    if (local_14 == 0) {
      *(undefined1 *)(in_RDI + 0x28) = 0;
    }
    else {
      std::operator+((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff20);
      std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      VRError::VRWarning(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128,
                         (string *)this);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator(&local_f9);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator(&local_a9);
      std::__cxx11::string::~string(local_38);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_78);
    }
  }
  return;
}

Assistant:

void VRSharedLibrary::unload() {
	if (_isLoaded)
	{
		const char* error = "";
#if defined(WIN32)
		BOOL result = FreeLibrary(_lib);

		if (result != 0) {

			LPVOID lpMsgBuf;
			DWORD dw = GetLastError();

			FormatMessage(
				FORMAT_MESSAGE_ALLOCATE_BUFFER |
				FORMAT_MESSAGE_FROM_SYSTEM |
				FORMAT_MESSAGE_IGNORE_INSERTS,
				NULL,
				dw,
				MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
				(LPTSTR)&lpMsgBuf,
				0, NULL);

			error = static_cast<const char *>(lpMsgBuf);
		}
#else
		dlerror();
		int result = dlclose(_lib);
		error = dlerror();
#endif
		if(result != 0) {
      VRWARNINGNOADV("Could not unload library: " + _filePath + " - " + error);
			return;
		}

		_isLoaded = false;
	}
}